

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int increase_cache_usage(spng_ctx *ctx,size_t bytes,int new_chunk)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  if (bytes == 0) {
    return 0x50;
  }
  if (new_chunk != 0) {
    uVar2 = ctx->chunk_count_total + 1;
    ctx->chunk_count_total = uVar2;
    if (uVar2 == 0) {
      return 3;
    }
    if (ctx->chunk_count_limit < uVar2) {
      return 0x4d;
    }
  }
  iVar1 = 3;
  uVar3 = bytes + ctx->chunk_cache_usage;
  if ((!CARRY8(bytes,ctx->chunk_cache_usage)) && (iVar1 = 0x4d, uVar3 <= ctx->chunk_cache_limit)) {
    ctx->chunk_cache_usage = uVar3;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int increase_cache_usage(spng_ctx *ctx, size_t bytes, int new_chunk)
{
    if(ctx == NULL || !bytes) return SPNG_EINTERNAL;

    if(new_chunk)
    {
        ctx->chunk_count_total++;
        if(ctx->chunk_count_total < 1) return SPNG_EOVERFLOW;

        if(ctx->chunk_count_total > ctx->chunk_count_limit) return SPNG_ECHUNK_LIMITS;
    }

    size_t new_usage = ctx->chunk_cache_usage + bytes;

    if(new_usage < ctx->chunk_cache_usage) return SPNG_EOVERFLOW;

    if(new_usage > ctx->chunk_cache_limit) return SPNG_ECHUNK_LIMITS;

    ctx->chunk_cache_usage = new_usage;

    return 0;
}